

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.h
# Opt level: O3

void __thiscall
DIS::EntityStatePdu::setDeadReckoningParameters(EntityStatePdu *this,DeadReckoningParameter *pX)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  float fVar9;
  
  cVar2 = pX->_otherParameters[0];
  cVar3 = pX->_otherParameters[1];
  cVar4 = pX->_otherParameters[2];
  cVar5 = pX->_otherParameters[3];
  cVar6 = pX->_otherParameters[4];
  cVar7 = pX->_otherParameters[5];
  cVar8 = pX->_otherParameters[6];
  uVar1 = *(undefined8 *)(pX->_otherParameters + 7);
  (this->_deadReckoningParameters)._deadReckoningAlgorithm = pX->_deadReckoningAlgorithm;
  (this->_deadReckoningParameters)._otherParameters[0] = cVar2;
  (this->_deadReckoningParameters)._otherParameters[1] = cVar3;
  (this->_deadReckoningParameters)._otherParameters[2] = cVar4;
  (this->_deadReckoningParameters)._otherParameters[3] = cVar5;
  (this->_deadReckoningParameters)._otherParameters[4] = cVar6;
  (this->_deadReckoningParameters)._otherParameters[5] = cVar7;
  (this->_deadReckoningParameters)._otherParameters[6] = cVar8;
  *(undefined8 *)((this->_deadReckoningParameters)._otherParameters + 7) = uVar1;
  fVar9 = (pX->_entityLinearAcceleration)._y;
  (this->_deadReckoningParameters)._entityLinearAcceleration._x = (pX->_entityLinearAcceleration)._x
  ;
  (this->_deadReckoningParameters)._entityLinearAcceleration._y = fVar9;
  (this->_deadReckoningParameters)._entityLinearAcceleration._z = (pX->_entityLinearAcceleration)._z
  ;
  fVar9 = (pX->_entityAngularVelocity)._y;
  (this->_deadReckoningParameters)._entityAngularVelocity._x = (pX->_entityAngularVelocity)._x;
  (this->_deadReckoningParameters)._entityAngularVelocity._y = fVar9;
  (this->_deadReckoningParameters)._entityAngularVelocity._z = (pX->_entityAngularVelocity)._z;
  return;
}

Assistant:

class OPENDIS6_EXPORT DeadReckoningParameter
{
protected:
  /** enumeration of what dead reckoning algorighm to use */
  unsigned char _deadReckoningAlgorithm; 

  /** other parameters to use in the dead reckoning algorithm */
  char _otherParameters[15]; 

  /** Linear acceleration of the entity */
  Vector3Float _entityLinearAcceleration; 

  /** angular velocity of the entity */
  Vector3Float _entityAngularVelocity; 


 public:
    DeadReckoningParameter();
    virtual ~DeadReckoningParameter();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getDeadReckoningAlgorithm() const; 
    void setDeadReckoningAlgorithm(unsigned char pX); 

    char*  getOtherParameters(); 
    const char*  getOtherParameters() const; 
    void setOtherParameters( const char*    pX);

    Vector3Float& getEntityLinearAcceleration(); 
    const Vector3Float&  getEntityLinearAcceleration() const; 
    void setEntityLinearAcceleration(const Vector3Float    &pX);

    Vector3Float& getEntityAngularVelocity(); 
    const Vector3Float&  getEntityAngularVelocity() const; 
    void setEntityAngularVelocity(const Vector3Float    &pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const DeadReckoningParameter& rhs) const;
}